

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O0

void __thiscall disruptor::test::SequenceBarrier::WaitForCursor::test_method(WaitForCursor *this)

{
  bool bVar1;
  thread waiter2;
  thread waiter;
  atomic<long> return_value;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  basic_cstring<const_char> *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  type *in_stack_fffffffffffffdb8;
  thread *in_stack_fffffffffffffdc0;
  undefined8 uVar2;
  basic_cstring<const_char> local_1e0;
  basic_cstring<const_char> local_1d0;
  undefined1 local_1c0 [40];
  undefined1 local_198 [16];
  basic_cstring<const_char> local_188 [2];
  iterator *local_160;
  iterator local_150;
  basic_cstring<const_char> local_148;
  undefined1 local_138 [40];
  undefined1 local_110 [16];
  basic_cstring<const_char> local_100 [2];
  iterator local_e0;
  basic_cstring<const_char> local_d8;
  undefined1 local_c8 [40];
  undefined1 local_a0 [32];
  basic_cstring<const_char> local_80;
  iterator *local_68;
  iterator local_58 [2];
  iterator local_48;
  memory_order local_40;
  undefined4 local_3c;
  iterator *local_38;
  iterator local_30;
  memory_order local_28;
  undefined4 local_24;
  iterator *local_20;
  iterator local_18;
  memory_order local_10;
  undefined4 local_c;
  iterator *local_8;
  
  local_58[0] = (iterator)0xffffffffffffffff;
  local_68 = local_58;
  std::thread::thread<disruptor::test::SequenceBarrier::WaitForCursor::test_method()::__0,,void>
            (in_stack_fffffffffffffdc0,(type *)in_stack_fffffffffffffdb8);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
               ,0x6e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_80,0x46,local_a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd98,(char (*) [1])in_stack_fffffffffffffd90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
               ,0x6e);
    local_8 = local_58;
    local_c = 5;
    local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_18 = local_58[0];
    local_e0 = local_58[0];
    in_stack_fffffffffffffd98 = "kInitialCursorValue";
    in_stack_fffffffffffffd90 = (basic_cstring<const_char> *)&kInitialCursorValue;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_c8,&local_d8,0x46,1,2,&local_e0,"return_value.load()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x10b9b6);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::thread::thread<disruptor::test::SequenceBarrier::WaitForCursor::test_method()::__1,,void>
            (in_stack_fffffffffffffdc0,(type *)in_stack_fffffffffffffdb8);
  std::thread::join();
  std::thread::~thread((thread *)0x10ba12);
  std::thread::join();
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
               ,0x6e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,local_100,0x49,local_110);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd98,(char (*) [1])in_stack_fffffffffffffd90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
               ,0x6e);
    local_20 = local_58;
    local_24 = 5;
    local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_30 = local_58[0];
    local_150 = local_58[0];
    in_stack_fffffffffffffd98 = "kFirstSequenceValue";
    in_stack_fffffffffffffd90 = (basic_cstring<const_char> *)&kFirstSequenceValue;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_138,&local_148,0x49,1,2,&local_150,"return_value.load()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x10bbd2);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_160 = local_58;
  std::thread::thread<disruptor::test::SequenceBarrier::WaitForCursor::test_method()::__2,,void>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::thread::thread<disruptor::test::SequenceBarrier::WaitForCursor::test_method()::__3,,void>
            (in_stack_fffffffffffffdc0,(type *)in_stack_fffffffffffffdb8);
  std::thread::join();
  std::thread::~thread((thread *)0x10bc65);
  std::thread::join();
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_188,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
               ,0x6e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,local_188,0x53,local_198);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd98,(char (*) [1])in_stack_fffffffffffffd90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
               ,0x6e);
    local_38 = local_58;
    local_3c = 5;
    local_40 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_48 = local_58[0];
    local_1e0.m_end = local_58[0];
    local_1e0.m_begin = (iterator)0x1;
    in_stack_fffffffffffffd98 = "kFirstSequenceValue + 1L";
    in_stack_fffffffffffffd90 = &local_1e0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1c0,&local_1d0,0x53,1,2,&local_1e0.m_end,"return_value.load()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x10be32);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::thread::~thread((thread *)0x10be58);
  std::thread::~thread((thread *)0x10be65);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(barrier.WaitFor(kFirstSequenceValue));
  });

  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);
  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);

  std::thread waiter2([this, &return_value]() {
    return_value.store(
        barrier.WaitFor(kFirstSequenceValue + 1L, std::chrono::seconds(5)));
  });

  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();

  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue + 1L);
}